

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastpackwithoutmask18_32(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  
  uVar2 = *in;
  *out = uVar2;
  uVar1 = in[1];
  *out = uVar1 << 0x12 | uVar2;
  uVar1 = uVar1 >> 0xe;
  out[1] = uVar1;
  uVar1 = in[2] << 4 | uVar1;
  out[1] = uVar1;
  uVar2 = in[3];
  out[1] = uVar2 << 0x16 | uVar1;
  uVar2 = uVar2 >> 10;
  out[2] = uVar2;
  uVar2 = in[4] << 8 | uVar2;
  out[2] = uVar2;
  uVar1 = in[5];
  out[2] = uVar1 << 0x1a | uVar2;
  uVar1 = uVar1 >> 6;
  out[3] = uVar1;
  uVar1 = in[6] << 0xc | uVar1;
  out[3] = uVar1;
  uVar2 = in[7];
  out[3] = uVar2 << 0x1e | uVar1;
  uVar2 = uVar2 >> 2;
  out[4] = uVar2;
  uVar1 = in[8];
  out[4] = uVar1 << 0x10 | uVar2;
  uVar1 = uVar1 >> 0x10;
  out[5] = uVar1;
  uVar1 = in[9] << 2 | uVar1;
  out[5] = uVar1;
  uVar2 = in[10];
  out[5] = uVar2 << 0x14 | uVar1;
  uVar2 = uVar2 >> 0xc;
  out[6] = uVar2;
  uVar2 = in[0xb] << 6 | uVar2;
  out[6] = uVar2;
  uVar1 = in[0xc];
  out[6] = uVar1 << 0x18 | uVar2;
  uVar1 = uVar1 >> 8;
  out[7] = uVar1;
  uVar1 = in[0xd] << 10 | uVar1;
  out[7] = uVar1;
  uVar2 = in[0xe];
  out[7] = uVar2 << 0x1c | uVar1;
  uVar2 = uVar2 >> 4;
  out[8] = uVar2;
  out[8] = in[0xf] << 0xe | uVar2;
  uVar2 = in[0x10];
  out[9] = uVar2;
  uVar1 = in[0x11];
  out[9] = uVar1 << 0x12 | uVar2;
  uVar1 = uVar1 >> 0xe;
  out[10] = uVar1;
  uVar1 = in[0x12] << 4 | uVar1;
  out[10] = uVar1;
  uVar2 = in[0x13];
  out[10] = uVar2 << 0x16 | uVar1;
  uVar2 = uVar2 >> 10;
  out[0xb] = uVar2;
  uVar2 = in[0x14] << 8 | uVar2;
  out[0xb] = uVar2;
  uVar1 = in[0x15];
  out[0xb] = uVar1 << 0x1a | uVar2;
  uVar1 = uVar1 >> 6;
  out[0xc] = uVar1;
  uVar1 = in[0x16] << 0xc | uVar1;
  out[0xc] = uVar1;
  uVar2 = in[0x17];
  out[0xc] = uVar2 << 0x1e | uVar1;
  uVar2 = uVar2 >> 2;
  out[0xd] = uVar2;
  uVar1 = in[0x18];
  out[0xd] = uVar1 << 0x10 | uVar2;
  uVar1 = uVar1 >> 0x10;
  out[0xe] = uVar1;
  uVar1 = in[0x19] << 2 | uVar1;
  out[0xe] = uVar1;
  uVar2 = in[0x1a];
  out[0xe] = uVar2 << 0x14 | uVar1;
  uVar2 = uVar2 >> 0xc;
  out[0xf] = uVar2;
  uVar2 = in[0x1b] << 6 | uVar2;
  out[0xf] = uVar2;
  uVar1 = in[0x1c];
  out[0xf] = uVar1 << 0x18 | uVar2;
  uVar1 = uVar1 >> 8;
  out[0x10] = uVar1;
  uVar1 = in[0x1d] << 10 | uVar1;
  out[0x10] = uVar1;
  uVar2 = in[0x1e];
  out[0x10] = uVar2 << 0x1c | uVar1;
  uVar2 = uVar2 >> 4;
  out[0x11] = uVar2;
  out[0x11] = in[0x1f] << 0xe | uVar2;
  return out + 0x12;
}

Assistant:

uint32_t *__fastpackwithoutmask18_32(const uint32_t *__restrict__ in,
                                     uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 18;
  ++out;
  *out = ((*in)) >> (18 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 22;
  ++out;
  *out = ((*in)) >> (18 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 26;
  ++out;
  *out = ((*in)) >> (18 - 12);
  ++in;
  *out |= ((*in)) << 12;
  ++in;
  *out |= ((*in)) << 30;
  ++out;
  *out = ((*in)) >> (18 - 16);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  *out = ((*in)) >> (18 - 2);
  ++in;
  *out |= ((*in)) << 2;
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  *out = ((*in)) >> (18 - 6);
  ++in;
  *out |= ((*in)) << 6;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (18 - 10);
  ++in;
  *out |= ((*in)) << 10;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (18 - 14);
  ++in;
  *out |= ((*in)) << 14;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 18;
  ++out;
  *out = ((*in)) >> (18 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 22;
  ++out;
  *out = ((*in)) >> (18 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 26;
  ++out;
  *out = ((*in)) >> (18 - 12);
  ++in;
  *out |= ((*in)) << 12;
  ++in;
  *out |= ((*in)) << 30;
  ++out;
  *out = ((*in)) >> (18 - 16);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  *out = ((*in)) >> (18 - 2);
  ++in;
  *out |= ((*in)) << 2;
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  *out = ((*in)) >> (18 - 6);
  ++in;
  *out |= ((*in)) << 6;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (18 - 10);
  ++in;
  *out |= ((*in)) << 10;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (18 - 14);
  ++in;
  *out |= ((*in)) << 14;
  ++out;
  ++in;

  return out;
}